

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::get_shader_precision_format
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  char *pcVar1;
  GLboolean shaderCompilerSupported;
  GLint precision [1];
  GLint range [2];
  GLboolean local_1a5;
  GLint local_1a4;
  GLint local_1a0 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  glu::CallLogWrapper::glGetBooleanv(&ctx->super_CallLogWrapper,0x8dfa,&local_1a5);
  local_198._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"// GL_SHADER_COMPILER = ",0x18);
  pcVar1 = "GL_TRUE";
  if (local_1a5 == '\0') {
    pcVar1 = "GL_FALSE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,pcVar1,(ulong)(local_1a5 == '\0') + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_120);
  local_1a0[0] = -0x32323233;
  local_1a0[1] = -0x32323233;
  local_1a4 = -0x32323233;
  local_198._0_8_ = (TestLog *)(local_198 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "GL_INVALID_ENUM is generated if shaderType or precisionType is not an accepted value."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_198);
  if ((TestLog *)local_198._0_8_ != (TestLog *)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&ctx->super_CallLogWrapper,0xffffffff,0x8df1,local_1a0,&local_1a4);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&ctx->super_CallLogWrapper,0x8b31,0xffffffff,local_1a0,&local_1a4);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,local_1a0,&local_1a4);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_shader_precision_format (NegativeTestContext& ctx)
{
	GLboolean	shaderCompilerSupported;
	GLint		range[2];
	GLint		precision[1];

	ctx.glGetBooleanv(GL_SHADER_COMPILER, &shaderCompilerSupported);
	ctx.getLog() << TestLog::Message << "// GL_SHADER_COMPILER = " << (shaderCompilerSupported ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

	deMemset(&range[0], 0xcd, sizeof(range));
	deMemset(&precision[0], 0xcd, sizeof(precision));

	ctx.beginSection("GL_INVALID_ENUM is generated if shaderType or precisionType is not an accepted value.");
	ctx.glGetShaderPrecisionFormat (-1, GL_MEDIUM_FLOAT, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetShaderPrecisionFormat (GL_VERTEX_SHADER, -1, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetShaderPrecisionFormat (-1, -1, &range[0], &precision[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}